

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIRFilter.cpp
# Opt level: O0

void __thiscall
SignalProcessing::FIRFilter::FIRFilter
          (FIRFilter *this,size_t number_of_taps,float input_sample_rate,float low_frequency,
          float high_frequency,float attenuation)

{
  ulong uVar1;
  float *pfVar2;
  reference pvVar3;
  short *filter_coefficients;
  float fVar4;
  float fVar5;
  float fVar6;
  uint local_68;
  float i_pi;
  uint i;
  vector<float,_std::allocator<float>_> A;
  float two_over_sample_rate;
  size_t Np;
  float local_28;
  float local_24;
  float attenuation_local;
  float high_frequency_local;
  float low_frequency_local;
  float input_sample_rate_local;
  size_t number_of_taps_local;
  FIRFilter *this_local;
  
  local_24 = high_frequency;
  attenuation_local = low_frequency;
  high_frequency_local = input_sample_rate;
  _low_frequency_local = number_of_taps;
  number_of_taps_local = (size_t)this;
  std::vector<short,_std::allocator<short>_>::vector(&this->filter_coefficients_);
  if (_low_frequency_local < 3) {
    _low_frequency_local = 3;
  }
  local_28 = attenuation;
  if (attenuation < 21.0) {
    local_28 = 21.0;
  }
  _low_frequency_local = _low_frequency_local | 1;
  std::vector<short,_std::allocator<short>_>::resize
            (&this->filter_coefficients_,_low_frequency_local);
  uVar1 = _low_frequency_local - 1 >> 1;
  A.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 2.0 / high_frequency_local;
  A.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = high_frequency_local * 0.5;
  pfVar2 = std::min<float>(&local_24,
                           (float *)&A.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
  local_24 = *pfVar2;
  std::allocator<float>::allocator((allocator<float> *)((long)&i_pi + 3));
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&i,uVar1 + 1,
             (allocator<float> *)((long)&i_pi + 3));
  std::allocator<float>::~allocator((allocator<float> *)((long)&i_pi + 3));
  fVar4 = ((local_24 - attenuation_local) * 2.0) / high_frequency_local;
  pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)&i,0);
  *pvVar3 = fVar4;
  for (local_68 = 1; local_68 <= uVar1; local_68 = local_68 + 1) {
    fVar4 = (float)local_68 * 3.1415927;
    fVar5 = sinf(A.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage._4_4_ * fVar4 * local_24);
    fVar6 = sinf(A.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage._4_4_ * fVar4 * attenuation_local);
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&i,(ulong)local_68);
    *pvVar3 = (fVar5 - fVar6) / fVar4;
  }
  filter_coefficients =
       std::vector<short,_std::allocator<short>_>::data(&this->filter_coefficients_);
  pfVar2 = std::vector<float,_std::allocator<float>_>::data
                     ((vector<float,_std::allocator<float>_> *)&i);
  coefficients_for_idealised_filter_response
            (filter_coefficients,pfVar2,local_28,_low_frequency_local);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)&i);
  return;
}

Assistant:

FIRFilter::FIRFilter(std::size_t number_of_taps, float input_sample_rate, float low_frequency, float high_frequency, float attenuation) {
	// we must be asked to filter based on an odd number of
	// taps, and at least three
	if(number_of_taps < 3) number_of_taps = 3;
	if(attenuation < 21.0f) attenuation = 21.0f;

	// ensure we have an odd number of taps
	number_of_taps |= 1;

	// store instance variables
	filter_coefficients_.resize(number_of_taps);

	/* calculate idealised filter response */
	std::size_t Np = (number_of_taps - 1) / 2;
	float two_over_sample_rate = 2.0f / input_sample_rate;

	// Clamp the high cutoff frequency.
	high_frequency = std::min(high_frequency, input_sample_rate * 0.5f);

	std::vector<float> A(Np+1);
	A[0] = 2.0f * (high_frequency - low_frequency) / input_sample_rate;
	for(unsigned int i = 1; i <= Np; ++i) {
		float i_pi = float(i) * float(M_PI);
		A[i] =
			(
				sinf(two_over_sample_rate * i_pi * high_frequency) -
				sinf(two_over_sample_rate * i_pi * low_frequency)
			) / i_pi;
	}

	FIRFilter::coefficients_for_idealised_filter_response(filter_coefficients_.data(), A.data(), attenuation, number_of_taps);
}